

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

Type * __thiscall hdc::Symbol::getType(Symbol *this)

{
  SymbolKind SVar1;
  Def *d;
  Class *c;
  Variable *v;
  Symbol *this_local;
  
  SVar1 = this->kind;
  if (SVar1 == SYMBOL_CLASS) {
    this_local = (Symbol *)Class::getSelfType((Class *)this->descriptor);
  }
  else if (SVar1 - SYMBOL_DEF < 2) {
    this_local = (Symbol *)Def::getReturnType((Def *)this->descriptor);
  }
  else if (SVar1 - SYMBOL_PARAMETER < 3) {
    this_local = (Symbol *)Variable::getType((Variable *)this->descriptor);
  }
  else {
    this_local = (Symbol *)0x0;
  }
  return (Type *)this_local;
}

Assistant:

Type *Symbol::getType() {
    Variable* v = nullptr;
    Class* c = nullptr;
    Def* d = nullptr;

    switch (kind) {
    case SYMBOL_PARAMETER:
    case SYMBOL_LOCAL_VARIABLE:
    case SYMBOL_CLASS_VARIABLE:
        v = (Variable*) descriptor;
        return v->getType();

    case SYMBOL_CLASS:
        c = (Class*) descriptor;
        return c->getSelfType();

    case SYMBOL_METHOD:
    case SYMBOL_DEF:
        d = (Def*) descriptor;
        //return d->getSelfType();
        return d->getReturnType(); // fix this later

    default:
        break;
    }

    return nullptr;
}